

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O1

CustomOperator * ExprEval::Operator::get_custom_specification(string *symbol)

{
  CustomOperator *pCVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  CustomOperator *pCVar4;
  long lVar5;
  long lVar6;
  
  pCVar1 = (CustomOperator *)*custom_operator_table;
  if (custom_operator_table[1] - (long)pCVar1 != 0) {
    lVar6 = (custom_operator_table[1] - (long)pCVar1 >> 3) * -0x79435e50d79435e5;
    __s2 = (symbol->_M_dataplus)._M_p;
    sVar2 = symbol->_M_string_length;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    lVar5 = 0;
    pCVar4 = pCVar1;
    do {
      __n = (pCVar4->symbol)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          return pCVar4;
        }
        iVar3 = bcmp((pCVar4->symbol)._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) {
          return pCVar1 + lVar5;
        }
      }
      lVar5 = lVar5 + 1;
      pCVar4 = pCVar4 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return (CustomOperator *)0x0;
}

Assistant:

Operator::CustomOperator* get_custom_specification(const std::string& symbol){
            auto table = custom_operator_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return &(table->at(i));
            }
            return nullptr;
        }